

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe53At6(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)*buf >> 6) | ((ulong)*(uint7 *)(buf + 1) & 0x7ffffffffffff) << 2;
}

Assistant:

std::uint64_t readFlUIntLe53At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[7];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x1fffffffffffff);
    return res;
}